

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O3

void mwNoMansLand(int level)

{
  int iVar1;
  int in_EDX;
  int extraout_EDX;
  int extraout_EDX_00;
  
  if (mwInited == 0) {
    mwUseAtexit = 1;
    mwInit();
    in_EDX = extraout_EDX;
  }
  if (mwTestAlways != 0) {
    mwTestNow((char *)0x0,0,1);
    in_EDX = extraout_EDX_00;
  }
  if (level == 2) {
    mwGrab_(0,0xfc,in_EDX);
    iVar1 = level;
  }
  else {
    iVar1 = level;
    if ((level != 1) && (iVar1 = mwNML, level == 0)) {
      mwDrop_(0,0xfc,0);
      iVar1 = level;
    }
  }
  mwNML = iVar1;
  return;
}

Assistant:

void mwNoMansLand(int level)
{
	mwAutoInit();
	TESTS(NULL, 0);
	switch (level) {
		case MW_NML_NONE:
			(void) mwDrop_(0, MW_VAL_NML, 0);
			break;
		case MW_NML_FREE:
			break;
		case MW_NML_ALL:
			(void) mwGrab_(0, MW_VAL_NML, 0);
			break;
		default:
			return;
	}
	mwNML = level;
}